

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_profiler.cpp
# Opt level: O2

string * __thiscall
duckdb::QueryProfiler::ToJSON_abi_cxx11_(string *__return_storage_ptr__,QueryProfiler *this)

{
  yyjson_val_pool *pyVar1;
  _Head_base<0UL,_duckdb::ProfilingNode_*,_false> _Var2;
  long lVar3;
  bool bVar4;
  bool bVar5;
  yyjson_mut_doc *doc;
  pointer pPVar6;
  ProfilingNode *node;
  yyjson_mut_val *pyVar7;
  yyjson_mut_val *object;
  yyjson_mut_val *pyVar8;
  yyjson_mut_val *pyVar9;
  char *pcVar10;
  yyjson_mut_doc *doc_00;
  optional_ptr<duckdb::ProfilingNode,_true> local_38;
  
  ::std::mutex::lock(&this->lock);
  doc = duckdb_yyjson::yyjson_mut_doc_new((yyjson_alc *)0x0);
  if (doc == (yyjson_mut_doc *)0x0) {
    doc_00 = (yyjson_mut_doc *)0x0;
  }
  else {
    pyVar1 = &doc->val_pool;
    doc_00 = (yyjson_mut_doc *)(doc->val_pool).cur;
    if ((yyjson_mut_doc *)(doc->val_pool).end == doc_00) {
      bVar5 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,&doc->alc,1);
      if (bVar5) {
        doc_00 = (yyjson_mut_doc *)pyVar1->cur;
        goto LAB_014763dd;
      }
LAB_01476723:
      doc_00 = (yyjson_mut_doc *)0x0;
    }
    else {
LAB_014763dd:
      pyVar1->cur = (yyjson_mut_val *)((yyjson_val_uni *)&doc_00->alc + 2);
      if (doc_00 == (yyjson_mut_doc *)0x0) goto LAB_01476723;
      doc_00->root = (yyjson_mut_val *)0x7;
    }
    doc->root = (yyjson_mut_val *)doc_00;
  }
  _Var2._M_head_impl =
       (this->root).
       super_unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>_>._M_t.
       super___uniq_ptr_impl<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::ProfilingNode_*,_std::default_delete<duckdb::ProfilingNode>_>.
       super__Head_base<0UL,_duckdb::ProfilingNode_*,_false>._M_head_impl;
  object = (yyjson_mut_val *)
           ((this->query_info).query_name._M_string_length | (ulong)_Var2._M_head_impl);
  if (object == (yyjson_mut_val *)0x0) {
    if (((doc != (yyjson_mut_doc *)0x0) && (doc_00 != (yyjson_mut_doc *)0x0)) &&
       ((~*(uint *)&doc_00->root & 7) == 0)) {
      pyVar1 = &doc->val_pool;
      object = (doc->val_pool).cur;
      if ((ulong)(((long)(doc->val_pool).end - (long)object) / 0x18) < 2) {
        bVar5 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,&doc->alc,2);
        if (!bVar5) goto LAB_014766d7;
        object = pyVar1->cur;
      }
      pyVar1->cur = object + 2;
      if (object != (yyjson_mut_val *)0x0) {
        pyVar9 = doc_00->root;
        object->tag = 0x60d;
        (object->uni).f64 = (double)"result";
        object[1].tag = 0x50d;
        pcVar10 = "empty";
LAB_01476697:
        object[1].uni.f64 = (double)pcVar10;
        pyVar7 = object;
        if ((yyjson_mut_val *)0xff < pyVar9) {
          lVar3 = *(long *)((doc_00->alc).malloc + 0x10);
          pyVar7 = *(yyjson_mut_val **)(lVar3 + 0x10);
          *(yyjson_mut_val **)(lVar3 + 0x10) = object;
        }
        object[1].next = pyVar7;
        object->next = object + 1;
        (doc_00->alc).malloc = (_func_void_ptr_void_ptr_size_t *)object;
        object = (yyjson_mut_val *)(ulong)*(byte *)&doc_00->root;
        doc_00->root = (yyjson_mut_val *)
                       ((long)&object[10].next + ((ulong)pyVar9 & 0xffffffffffffff00));
      }
    }
  }
  else {
    if (_Var2._M_head_impl != (ProfilingNode *)0x0) {
      pPVar6 = unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>,_true>::
               operator->(&this->root);
      ProfilingInfo::WriteMetricsToJSON(&pPVar6->profiling_info,doc,(yyjson_mut_val *)doc_00);
      bVar5 = true;
      if (doc == (yyjson_mut_doc *)0x0) {
LAB_01476766:
        pyVar9 = (yyjson_mut_val *)0x0;
      }
      else {
        pyVar1 = &doc->val_pool;
        pyVar9 = (doc->val_pool).cur;
        if ((doc->val_pool).end == pyVar9) {
          bVar4 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,&doc->alc,1);
          if (!bVar4) goto LAB_01476766;
          pyVar9 = pyVar1->cur;
        }
        object = pyVar9 + 1;
        pyVar1->cur = object;
        if (pyVar9 == (yyjson_mut_val *)0x0) goto LAB_01476766;
        pyVar9->tag = 6;
        if ((doc_00 != (yyjson_mut_doc *)0x0) && ((~*(uint *)&doc_00->root & 7) == 0)) {
          if ((ulong)(((long)(doc->val_pool).end - (long)object) / 0x18) < 2) {
            bVar5 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,&doc->alc,2);
            if (bVar5) {
              object = pyVar1->cur;
              pyVar1->cur = object + 2;
              if (object != (yyjson_mut_val *)0x0) goto LAB_014764a5;
            }
          }
          else {
            pyVar1->cur = pyVar9 + 3;
LAB_014764a5:
            pyVar7 = doc_00->root;
            object->tag = 0x80d;
            (object->uni).f64 = (double)"children";
            pyVar8 = object;
            if ((yyjson_mut_val *)0xff < pyVar7) {
              lVar3 = *(long *)((doc_00->alc).malloc + 0x10);
              pyVar8 = *(yyjson_mut_val **)(lVar3 + 0x10);
              *(yyjson_mut_val **)(lVar3 + 0x10) = object;
            }
            pyVar9->next = pyVar8;
            object->next = pyVar9;
            (doc_00->alc).malloc = (_func_void_ptr_void_ptr_size_t *)object;
            object = (yyjson_mut_val *)(ulong)*(byte *)&doc_00->root;
            doc_00->root = (yyjson_mut_val *)
                           ((long)&object[10].next + ((ulong)pyVar7 & 0xffffffffffffff00));
          }
        }
        bVar5 = false;
      }
      pPVar6 = unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>,_true>::
               operator->(&this->root);
      local_38 = ProfilingNode::GetChild(pPVar6,0);
      node = optional_ptr<duckdb::ProfilingNode,_true>::operator*(&local_38);
      pyVar7 = ToJSONRecursive(doc,node);
      if (((!bVar5) && (pyVar7 != (yyjson_mut_val *)0x0)) &&
         (object = (yyjson_mut_val *)pyVar9->tag, ((uint)object & 7) == 6)) {
        pyVar9->tag = ((ulong)object & 0xfffffffffffffffe) + 0x100;
        pyVar8 = pyVar7;
        if ((yyjson_mut_val *)0xff < object) {
          object = (yyjson_mut_val *)(pyVar9->uni).str;
          pyVar8 = object->next;
          object->next = pyVar7;
        }
        pyVar7->next = pyVar8;
        (pyVar9->uni).str = (char *)pyVar7;
      }
      StringifyAndFree_abi_cxx11_(__return_storage_ptr__,(duckdb *)doc,doc_00,object);
      goto LAB_014766e5;
    }
    if (((doc != (yyjson_mut_doc *)0x0) && (doc_00 != (yyjson_mut_doc *)0x0)) &&
       ((~*(uint *)&doc_00->root & 7) == 0)) {
      pyVar1 = &doc->val_pool;
      object = (doc->val_pool).cur;
      if ((ulong)(((long)(doc->val_pool).end - (long)object) / 0x18) < 2) {
        bVar5 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,&doc->alc,2);
        if (!bVar5) goto LAB_014766d7;
        object = pyVar1->cur;
      }
      pyVar1->cur = object + 2;
      if (object != (yyjson_mut_val *)0x0) {
        pyVar9 = doc_00->root;
        object->tag = 0x60d;
        (object->uni).f64 = (double)"result";
        object[1].tag = 0x50d;
        pcVar10 = "error";
        goto LAB_01476697;
      }
    }
  }
LAB_014766d7:
  StringifyAndFree_abi_cxx11_(__return_storage_ptr__,(duckdb *)doc,doc_00,object);
LAB_014766e5:
  pthread_mutex_unlock((pthread_mutex_t *)&this->lock);
  return __return_storage_ptr__;
}

Assistant:

string QueryProfiler::ToJSON() const {
	lock_guard<std::mutex> guard(lock);
	auto doc = yyjson_mut_doc_new(nullptr);
	auto result_obj = yyjson_mut_obj(doc);
	yyjson_mut_doc_set_root(doc, result_obj);

	if (query_info.query_name.empty() && !root) {
		yyjson_mut_obj_add_str(doc, result_obj, "result", "empty");
		return StringifyAndFree(doc, result_obj);
	}
	if (!root) {
		yyjson_mut_obj_add_str(doc, result_obj, "result", "error");
		return StringifyAndFree(doc, result_obj);
	}

	auto &settings = root->GetProfilingInfo();

	settings.WriteMetricsToJSON(doc, result_obj);

	// recursively print the physical operator tree
	auto children_list = yyjson_mut_arr(doc);
	yyjson_mut_obj_add_val(doc, result_obj, "children", children_list);
	auto child = ToJSONRecursive(doc, *root->GetChild(0));
	yyjson_mut_arr_add_val(children_list, child);
	return StringifyAndFree(doc, result_obj);
}